

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_sad_test.cc
# Opt level: O2

void __thiscall
(anonymous_namespace)::ObmcSadHBDTest_ExtremeValues_Test::~ObmcSadHBDTest_ExtremeValues_Test
          (ObmcSadHBDTest_ExtremeValues_Test *this)

{
  anon_unknown.dwarf_1b52ba8::ObmcSadHBDTest_ExtremeValues_Test::~ObmcSadHBDTest_ExtremeValues_Test
            ((ObmcSadHBDTest_ExtremeValues_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(ObmcSadHBDTest, ExtremeValues) {
  DECLARE_ALIGNED(32, uint16_t, pre[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, wsrc[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, mask[MAX_SB_SQUARE]);

  for (int iter = 0; iter < MAX_SB_SIZE && !HasFatalFailure(); ++iter) {
    const int pre_stride = iter;

    for (int i = 0; i < MAX_SB_SQUARE; ++i) {
      pre[i] = (1 << 12) - 1;
      wsrc[i] = ((1 << 12) - 1) * kMaskMax * kMaskMax;
      mask[i] = kMaskMax * kMaskMax;
    }

    const unsigned int ref_res =
        params_.ref_func(CONVERT_TO_BYTEPTR(pre), pre_stride, wsrc, mask);
    unsigned int tst_res;
    API_REGISTER_STATE_CHECK(
        tst_res =
            params_.tst_func(CONVERT_TO_BYTEPTR(pre), pre_stride, wsrc, mask));

    ASSERT_EQ(ref_res, tst_res);
  }
}